

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::iterate(HEkkDual *this)

{
  HVector *row_ep;
  HEkk *pHVar1;
  bool bVar2;
  
  pHVar1 = this->ekk_instance_;
  if (pHVar1->debug_solve_report_ == true) {
    bVar2 = (uint)pHVar1->iteration_count_ < 0x65;
    pHVar1->debug_iteration_report_ = bVar2;
    if (bVar2) {
      printf("HEkkDual::iterate Debug iteration %d\n");
    }
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,10,0);
  chooseRow(this);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,10,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0xb,0);
  row_ep = &this->row_ep;
  chooseColumn(this,row_ep);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0xb,0);
  bVar2 = HEkk::isBadBasisChange
                    (this->ekk_instance_,kDual,this->variable_in,this->row_out,this->rebuild_reason)
  ;
  if (bVar2) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0xc,0);
  updateFtranBFRT(this);
  updateFtran(this);
  if (this->edge_weight_mode == kSteepestEdge) {
    updateFtranDSE(this,row_ep);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0xc,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0xd,0);
  updateVerify(this);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0xd,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0xe,0);
  updateDual(this);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0xe,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0xf,0);
  updatePrimal(this,row_ep);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0xf,0);
  (this->ekk_instance_->status_).has_primal_objective_value = false;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x11,0);
  updatePivots(this);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x11,0);
  if (this->new_devex_framework == true) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x10,0);
    initialiseDevexFramework(this);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x10,0);
  }
  iterationAnalysis(this);
  return;
}

Assistant:

void HEkkDual::iterate() {
  // This is the main iteration loop for dual revised simplex. All the
  // methods have as their first line if (rebuild_reason) return;, where
  // rebuild_reason is, for example, set to 1 when CHUZR finds no
  // candidate. This causes a break from the inner loop of
  // solvePhase% and, hence, a call to rebuild()

  // Reporting:
  // Row-wise matrix after update in updateMatrix(variable_in, variable_out);

  const HighsInt from_check_iter = 0;
  const HighsInt to_check_iter = from_check_iter + 100;
  if (ekk_instance_.debug_solve_report_) {
    ekk_instance_.debug_iteration_report_ =
        ekk_instance_.iteration_count_ >= from_check_iter &&
        ekk_instance_.iteration_count_ <= to_check_iter;
    if (ekk_instance_.debug_iteration_report_) {
      printf("HEkkDual::iterate Debug iteration %d\n",
             (int)ekk_instance_.iteration_count_);
    }
  }

  analysis->simplexTimerStart(IterateChuzrClock);
  chooseRow();
  analysis->simplexTimerStop(IterateChuzrClock);

  analysis->simplexTimerStart(IterateChuzcClock);
  chooseColumn(&row_ep);
  analysis->simplexTimerStop(IterateChuzcClock);

  if (isBadBasisChange()) return;

  analysis->simplexTimerStart(IterateFtranClock);
  updateFtranBFRT();

  // updateFtran(); computes the pivotal column in the data structure "column"
  updateFtran();

  // updateFtranDSE performs the DSE FTRAN on pi_p
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge)
    updateFtranDSE(&row_ep);
  analysis->simplexTimerStop(IterateFtranClock);

  // updateVerify() Checks row-wise pivot against column-wise pivot for
  // numerical trouble
  analysis->simplexTimerStart(IterateVerifyClock);
  updateVerify();
  analysis->simplexTimerStop(IterateVerifyClock);

  // updateDual() Updates the dual values
  analysis->simplexTimerStart(IterateDualClock);
  updateDual();
  analysis->simplexTimerStop(IterateDualClock);

  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  //  updatePrimal");
  // updatePrimal(&row_ep); Updates the primal values and the edge weights
  analysis->simplexTimerStart(IteratePrimalClock);
  updatePrimal(&row_ep);
  analysis->simplexTimerStop(IteratePrimalClock);
  // After primal update in dual simplex the primal objective value is not known
  ekk_instance_.status_.has_primal_objective_value = false;
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  updatePrimal");

  // Update the records of chosen rows and pivots
  //  ekk_instance_.info_.pivot_.push_back(alpha_row);
  //  ekk_instance_.info_.index_chosen_.push_back(row_out);

  // Update the basis representation
  analysis->simplexTimerStart(IteratePivotsClock);
  updatePivots();
  analysis->simplexTimerStop(IteratePivotsClock);

  if (new_devex_framework) {
    // Initialise new Devex framework
    analysis->simplexTimerStart(IterateDevexIzClock);
    initialiseDevexFramework();
    analysis->simplexTimerStop(IterateDevexIzClock);
  }

  // Analyse the iteration: possibly report; possibly switch strategy
  iterationAnalysis();
}